

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.c
# Opt level: O0

void maybe_tutorial(void)

{
  level *plVar1;
  boolean bVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  obj *local_58;
  obj *otmp_1;
  obj *otmp;
  int launcher_groups;
  int projectile_groups;
  boolean firstturn;
  int incdec;
  rm *l;
  int ly;
  int lx;
  int monnum;
  int dy;
  int dx;
  monst *mtmp;
  int i;
  int old_tutorial_last_combat;
  
  if (flags.tutorial == '\0') {
    return;
  }
  bVar2 = check_tutorial_message(0xc9);
  if (bVar2 != '\0') {
    return;
  }
  if (3 < moves) {
    ly = -1;
    for (monnum = -1; monnum < 2; monnum = monnum + 1) {
      for (lx = -1; plVar1 = level, lx < 2; lx = lx + 1) {
        if ((((0 < u.ux + monnum) && (u.ux + monnum < 0x50)) && (-1 < u.uy + lx)) &&
           (u.uy + lx < 0x15)) {
          iVar4 = u.ux + monnum;
          iVar5 = u.uy + lx;
          bVar2 = check_tutorial_location(iVar4,iVar5,'\0');
          if (bVar2 != '\0') {
            return;
          }
          if (((*(uint *)&plVar1->locations[iVar4][iVar5].field_0x6 >> 3 & 1) != 0) &&
             (bVar2 = check_tutorial_message(0xd5), bVar2 != '\0')) {
            return;
          }
          iVar6 = dbuf_get_mon(iVar4,iVar5);
          if (iVar6 != 0) {
            iVar6 = dbuf_get_mon(iVar4,iVar5);
            if ((ly == iVar6 + -1) && (bVar2 = check_tutorial_message(0x10d), bVar2 != '\0')) {
              return;
            }
            iVar4 = dbuf_get_mon(iVar4,iVar5);
            ly = iVar4 + -1;
          }
        }
      }
    }
  }
  iVar4 = tutorial_last_combat + 1;
  tutorial_last_combat = iVar4;
  for (_dy = level->monlist; _dy != (monst *)0x0; _dy = _dy->nmon) {
    if (((0 < _dy->mhp) && ((viz_array[_dy->my][_dy->mx] & 2U) != 0)) && (_dy->mtame == '\0')) {
      tutorial_last_combat = 0;
    }
  }
  if ((tutorial_last_combat == 0) && (5 < iVar4)) {
    if (('\x02' < u.uz.dlevel) &&
       ((flags.elbereth_enabled != '\0' && (bVar2 = check_tutorial_message(0x125), bVar2 != '\0'))))
    {
      return;
    }
    mtmp._0_4_ = 0;
    while( true ) {
      bVar7 = false;
      if ((int)mtmp < 0x2b) {
        bVar7 = spl_book[(int)mtmp].sp_id != 0;
      }
      if (!bVar7) break;
      if ((spl_book[(int)mtmp].sp_id == 0x187) &&
         (bVar2 = check_tutorial_message(0x122), bVar2 != '\0')) {
        return;
      }
      mtmp._0_4_ = (int)mtmp + 1;
    }
    bVar2 = check_tutorial_message(0x126);
    if (bVar2 != '\0') {
      return;
    }
  }
  if ((((spl_book[1].sp_id == 0) ||
       (((((((uarm == (obj *)0x0 || ((*(ushort *)&objects[uarm->otyp].field_0x11 >> 4 & 0x1f) < 0xb)
             ) || (0x11 < (*(ushort *)&objects[uarm->otyp].field_0x11 >> 4 & 0x1f))) &&
           ((uarms == (obj *)0x0 || (urole.malenum == 0x161)))) &&
          (((uarmh == (obj *)0x0 ||
            (((*(ushort *)&objects[uarmh->otyp].field_0x11 >> 4 & 0x1f) < 0xb ||
             (0x11 < (*(ushort *)&objects[uarmh->otyp].field_0x11 >> 4 & 0x1f))))) ||
           (uarmh->otyp == 0x51)))) &&
         ((((uarmg == (obj *)0x0 ||
            ((*(ushort *)&objects[uarmg->otyp].field_0x11 >> 4 & 0x1f) < 0xb)) ||
           (0x11 < (*(ushort *)&objects[uarmg->otyp].field_0x11 >> 4 & 0x1f))) &&
          (((uarmf == (obj *)0x0 ||
            ((*(ushort *)&objects[uarmf->otyp].field_0x11 >> 4 & 0x1f) < 0xb)) ||
           (0x11 < (*(ushort *)&objects[uarmf->otyp].field_0x11 >> 4 & 0x1f))))))) ||
        (bVar2 = check_tutorial_message(0x154), bVar2 == '\0')))) &&
      (((uwep == (obj *)0x0 || (uwep == &zeroobj)) ||
       ((iVar5 = weapon_dam_bonus(uwep), -1 < iVar5 ||
        ((u.twoweap != '\0' || (bVar2 = check_tutorial_message(0x155), bVar2 == '\0')))))))) &&
     (((u.ulevel < 2 || (bVar2 = check_tutorial_message(0x140), bVar2 == '\0')) &&
      ((u.ulevel < 3 || (bVar2 = check_tutorial_message(0x141), bVar2 == '\0')))))) {
    projectile_groups = 0;
    bVar7 = tutorial_old_attribs.a[0] == '\0';
    for (mtmp._0_4_ = 0; (int)mtmp < 6; mtmp._0_4_ = (int)mtmp + 1) {
      if (tutorial_old_attribs.a[(int)mtmp] < u.acurr.a[(int)mtmp]) {
        projectile_groups = 1;
      }
      if (u.acurr.a[(int)mtmp] < tutorial_old_attribs.a[(int)mtmp]) {
        projectile_groups = -1;
      }
      tutorial_old_attribs.a[(int)mtmp] = u.acurr.a[(int)mtmp];
    }
    if (((((bVar7) ||
          (((projectile_groups < 1 || (bVar2 = check_tutorial_message(0x142), bVar2 == '\0')) &&
           ((-1 < projectile_groups || (bVar2 = check_tutorial_message(0x143), bVar2 == '\0'))))))
         && (((tutorial_old_ac <= u.uac || (tutorial_old_ac == 300)) ||
             (bVar2 = check_tutorial_message(0x148), bVar2 == '\0')))) &&
        (((((tutorial_old_ac = (int)u.uac, u.uprops[0x1c].intrinsic == 0 &&
            (u.uprops[0x1d].intrinsic == 0)) &&
           (((u.uprops[0x1e].intrinsic == 0 &&
             (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
              (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
            ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))))) &&
          ((((u.uprops[0x1b].intrinsic == 0 &&
             ((u.umonnum != 0x9e && ((youmonst.data)->mlet != '\x1c')))) &&
            ((u.uprops[0x23].intrinsic == 0 ||
             ((u.uprops[0x24].extrinsic != 0 ||
              ((u.umonnum != u.umonster && (bVar2 = dmgtype(youmonst.data,0x24), bVar2 != '\0'))))))
            )) && (u.uprops[0x3a].intrinsic == 0)))) ||
         (bVar2 = check_tutorial_message(0x14c), bVar2 == '\0')))) &&
       (((((((u.uz.dlevel < '\x02' || (bVar2 = check_tutorial_message(0x144), bVar2 == '\0')) &&
            (((u.uz.dlevel < '\n' || (bVar2 = check_tutorial_message(0x113), bVar2 == '\0')) &&
             ((u.uhpmax <= u.uhp || (bVar2 = check_tutorial_message(0x145), bVar2 == '\0')))))) &&
           ((u.uenmax <= u.uen || (bVar2 = check_tutorial_message(0x146), bVar2 == '\0')))) &&
          (((((((4 < u.uen || (u.uenmax < 0xb)) ||
               (bVar2 = check_tutorial_message(0x147), bVar2 == '\0')) &&
              ((u.umonster == u.umonnum || (bVar2 = check_tutorial_message(0x14e), bVar2 == '\0'))))
             && ((u.uexp < 1 || (bVar2 = check_tutorial_message(0x149), bVar2 == '\0')))) &&
            ((u.uhs < 2 || (bVar2 = check_tutorial_message(0x14a), bVar2 == '\0')))) &&
           ((u.uhs != 0 || (bVar2 = check_tutorial_message(0x14b), bVar2 == '\0')))))) &&
         ((((((bVar2 = can_advance_something(), bVar2 == '\0' ||
              (bVar2 = check_tutorial_message(0x14d), bVar2 == '\0')) &&
             (((u._1052_1_ & 1) == 0 || (bVar2 = check_tutorial_message(0x156), bVar2 == '\0')))) &&
            ((iVar5 = near_capacity(), iVar5 < 1 ||
             (bVar2 = check_tutorial_message(0x151), bVar2 == '\0')))) &&
           ((iVar5 = in_trouble(), iVar5 < 1 ||
            (((bVar2 = can_pray('\0'), bVar2 == '\0' || (level->locations[u.ux][u.uy].typ == '!'))
             || (bVar2 = check_tutorial_message(0x150), bVar2 == '\0')))))) &&
          ((((cVar3 = inside_shop(level,u.ux,u.uy), cVar3 == '\0' ||
             (bVar2 = check_tutorial_message(0x168), bVar2 == '\0')) &&
            ((u.uz.dnum != dungeon_topology.d_mines_dnum ||
             (bVar2 = check_tutorial_message(0x16a), bVar2 == '\0')))) &&
           ((u.uz.dnum != dungeon_topology.d_sokoban_dnum ||
            (bVar2 = check_tutorial_message(0x16b), bVar2 == '\0')))))))) &&
        ((check_tutorial_command_message != 0x112 ||
         (bVar2 = check_tutorial_message(0x112), bVar2 == '\0')))))) {
      otmp._4_4_ = 0;
      otmp._0_4_ = 0;
      for (otmp_1 = invent; otmp_1 != (obj *)0x0; otmp_1 = otmp_1->nobj) {
        if ((((*(uint *)&otmp_1->field_0x4a >> 6 & 1) != 0) &&
            ((*(uint *)&otmp_1->field_0x4a & 1) != 0)) &&
           (bVar2 = check_tutorial_message(0x152), bVar2 != '\0')) {
          return;
        }
        if ((otmp_1->oartifact != '\0') && (bVar2 = check_tutorial_message(0x13e), bVar2 != '\0')) {
          return;
        }
        if (((*(uint *)&otmp_1->field_0x4a >> 2 & 1) != 0) &&
           (bVar2 = check_tutorial_message(0x169), bVar2 != '\0')) {
          return;
        }
        if ((objects[otmp_1->otyp].field_0x10 & 1) == 0) {
          switch(objects[otmp_1->otyp].oc_class) {
          case '\x04':
          case '\x05':
switchD_00318607_caseD_4:
            bVar2 = check_tutorial_message(0x13f);
            if (bVar2 != '\0') {
              return;
            }
            break;
          default:
            break;
          case '\b':
            if (otmp_1->otyp != 0x14f) goto switchD_00318607_caseD_9;
            break;
          case '\t':
switchD_00318607_caseD_9:
            if (otmp_1->otyp != 0x17c) goto switchD_00318607_caseD_a;
            break;
          case '\n':
          case '\v':
switchD_00318607_caseD_a:
            if ((otmp_1->otyp != 0x1bc) && (otmp_1->otyp != 0x1bd)) goto switchD_00318607_caseD_4;
          }
        }
        iVar5 = (int)otmp_1->otyp;
        if ((iVar5 - 0xdaU < 2) || (iVar5 == 0xdd)) {
LAB_003186da:
          bVar2 = check_tutorial_message(0x135);
          if (bVar2 != '\0') {
            return;
          }
        }
        else if (iVar5 == 0xde) {
          if ((urole.malenum != 0x159) && (urole.malenum != 0x164)) goto LAB_003186da;
        }
        else if (iVar5 - 0xdfU < 2) goto LAB_003186da;
        if ((tutorial_last_combat == 0) && (5 < iVar4)) {
          iVar5 = (int)otmp_1->otyp;
          if (iVar5 - 1U < 5) {
            otmp._4_4_ = otmp._4_4_ | 1;
          }
          else if (iVar5 == 6) {
            otmp._4_4_ = otmp._4_4_ | 2;
          }
          else if (((iVar5 - 7U < 7) || (iVar5 == 0xf)) || (iVar5 - 0x11U < 4)) {
            if ((otmp_1 != uwep) && (bVar2 = check_tutorial_message(0x123), bVar2 != '\0')) {
              return;
            }
          }
          else if (iVar5 - 0x42U < 4) {
            otmp._0_4_ = (uint)otmp | 1;
          }
          else if (iVar5 == 0x46) {
            otmp._0_4_ = (uint)otmp | 4;
          }
          else if (iVar5 == 0x47) {
            otmp._0_4_ = (uint)otmp | 2;
          }
          else if (iVar5 - 0x212U < 2) {
            otmp._4_4_ = otmp._4_4_ | 4;
          }
        }
      }
      if (((otmp._4_4_ & (uint)otmp) == 0) || (bVar2 = check_tutorial_message(0x124), bVar2 == '\0')
         ) {
        for (local_58 = level->objects[u.ux][u.uy]; local_58 != (obj *)0x0;
            local_58 = (local_58->v).v_nexthere) {
          if ((((int)local_58->otyp - 0xdaU < 2) || (local_58->otyp == 0xdd)) &&
             (bVar2 = check_tutorial_message(0x135), bVar2 != '\0')) {
            return;
          }
        }
        if ((((5 < tutorial_last_combat) &&
             ((check_tutorial_command_message < 1 ||
              (bVar2 = check_tutorial_message(check_tutorial_command_message), bVar2 == '\0')))) &&
            (((moves < 10 || (bVar2 = check_tutorial_message(0x118), bVar2 == '\0')) &&
             (((moves < 0x1e || (bVar2 = check_tutorial_message(0x119), bVar2 == '\0')) &&
              ((moves < 0x3c || (bVar2 = check_tutorial_message(0x11a), bVar2 == '\0')))))))) &&
           (((moves < 100 || (bVar2 = check_tutorial_message(0x11b), bVar2 == '\0')) &&
            (0x95 < moves)))) {
          check_tutorial_message(0x11c);
        }
      }
    }
  }
  return;
}

Assistant:

void maybe_tutorial(void)
{
	int old_tutorial_last_combat;
	int i;
	const struct monst *mtmp;

	if (!flags.tutorial) return; /* short-circuit */

	/* Check to see if any tutorial triggers have occured.
	   Stop checking once one message is output. */

	/* Welcome message: show immediately */
	if (check_tutorial_message(QT_T_WELCOME)) return;

	/* Check surroundings; these only occur if at least 3 turns
	   have elapsed, to avoid overwhelming the player early on. */
	if (moves > 3) {
	    int dx, dy;
	    int monnum = -1;
	    for (dx = -1; dx <= 1; dx++) {
		for (dy = -1; dy <= 1; dy++) {
		    if (isok(u.ux + dx, u.uy + dy)) {
			int lx = u.ux + dx;
			int ly = u.uy + dy;
			const struct rm *l = &level->locations[lx][ly];

			/* Terrain checks */
			if (check_tutorial_location(lx, ly, FALSE)) return;

			/* Adjacent invisible monsters */
			if (l->mem_invis)
			    if (check_tutorial_message(QT_T_LOOK_INVISIBLE)) return;

			/* More than one of the same monster adjacent */
			if (dbuf_get_mon(lx, ly)) {
			    if (monnum == (dbuf_get_mon(lx, ly) - 1))
				if (check_tutorial_message(QT_T_CALLMONSTER)) return;
			    monnum = dbuf_get_mon(lx, ly) - 1;
			}
		    }
		}
	    }
	}

	/* Check to see if we're in combat. */
	tutorial_last_combat++;
	old_tutorial_last_combat = tutorial_last_combat;
	for (mtmp = level->monlist; mtmp; mtmp = mtmp->nmon)
	    if (!DEADMONSTER(mtmp) && cansee(mtmp->mx, mtmp->my) && !mtmp->mtame)
		tutorial_last_combat = 0;

	/* Ambient messages that only come up during combat, and only one
	   message per combat */
	if (!tutorial_last_combat && old_tutorial_last_combat > 5) {
	    if (u.uz.dlevel >= 3)
		if (flags.elbereth_enabled &&
		    check_tutorial_message(QT_T_ELBERETH)) return;
	    for (i = 0; i < MAXSPELL && spellid(i) != NO_SPELL; i++) {
		if (spellid(i) == SPE_FORCE_BOLT)
		    if (check_tutorial_message(QT_T_SPELLS)) return;
	    }
	    if (check_tutorial_message(QT_T_MELEE)) return;
	}

	/* Events! */

	if (spellid(1)) {
	    if ((uarm && is_metallic(uarm)) ||
		(uarms && !Role_if(PM_PRIEST)) || /* priests start with shields */
		(uarmh && is_metallic(uarmh) && uarmh->otyp != HELM_OF_BRILLIANCE) ||
		(uarmg && is_metallic(uarmg)) ||
		(uarmf && is_metallic(uarmf)))
		if (check_tutorial_message(QT_T_CASTER_ARMOR)) return;
	}

	if (uwep && uwep != &zeroobj && weapon_dam_bonus(uwep) < 0 && !u.twoweap)
	    if (check_tutorial_message(QT_T_WEAPON_SKILL)) return;
	if (u.ulevel >= 2)
	    if (check_tutorial_message(QT_T_LEVELUP)) return;
	if (u.ulevel >= 3)
	    if (check_tutorial_message(QT_T_RANKUP)) return;
	{
	    int incdec = 0;
	    boolean firstturn = tutorial_old_attribs.a[0] == 0;
	    for (i = 0; i < A_MAX; i++) {
		if (u.acurr.a[i] > tutorial_old_attribs.a[i]) incdec = 1;
		if (u.acurr.a[i] < tutorial_old_attribs.a[i]) incdec = -1;
		tutorial_old_attribs.a[i] = u.acurr.a[i];
	    }
	    if (!firstturn) {
		if (incdec > 0)
		    if (check_tutorial_message(QT_T_ABILUP)) return;
		if (incdec < 0)
		    if (check_tutorial_message(QT_T_ABILDOWN)) return;
	    }
	}
	if (u.uac < tutorial_old_ac && tutorial_old_ac != TUTORIAL_IMPOSSIBLE_AC)
	    if (check_tutorial_message(QT_T_ACIMPROVED)) return;
	tutorial_old_ac = u.uac;

	if (Confusion || Sick || Blind || Stunned || Hallucination || Slimed)
	    if (check_tutorial_message(QT_T_STATUS)) return;

	if (u.uz.dlevel >= 2)
	    if (check_tutorial_message(QT_T_DLEVELCHANGE)) return;
	if (u.uz.dlevel >= 10)
	    if (check_tutorial_message(QT_T_DGN_OVERVIEW)) return;

	if (u.uhp < u.uhpmax)
	    if (check_tutorial_message(QT_T_DAMAGED)) return;
	if (u.uen < u.uenmax)
	    if (check_tutorial_message(QT_T_PWUSED)) return;
	if (u.uen < 5 && u.uenmax > 10)
	    if (check_tutorial_message(QT_T_PWEMPTY)) return;

	if (u.umonster != u.umonnum)
	    if (check_tutorial_message(QT_T_POLYSELF)) return;

	if (u.uexp > 0)
	    if (check_tutorial_message(QT_T_GAINEDEXP)) return;

	if (u.uhs >= HUNGRY)
	    if (check_tutorial_message(QT_T_HUNGER)) return;
	if (u.uhs <= SATIATED)
	    if (check_tutorial_message(QT_T_SATIATION)) return;

	if (can_advance_something())
	    if (check_tutorial_message(QT_T_ENHANCE)) return;

	if (u.uswallow)
	    if (check_tutorial_message(QT_T_ENGULFED)) return;

	if (near_capacity() > UNENCUMBERED)
	    if (check_tutorial_message(QT_T_BURDEN)) return;

	if (in_trouble() > 0 && can_pray(0) &&
	    !IS_ALTAR(level->locations[u.ux][u.uy].typ))
	    if (check_tutorial_message(QT_T_MAJORTROUBLE)) return;

	if (inside_shop(level, u.ux, u.uy))
	    if (check_tutorial_message(QT_T_SHOPENTRY)) return;

	if (u.uz.dnum == mines_dnum)
	    if (check_tutorial_message(QT_T_MINES)) return;
	if (u.uz.dnum == sokoban_dnum)
	    if (check_tutorial_message(QT_T_SOKOBAN)) return;
	if (check_tutorial_command_message == QT_T_FIRE)
	    if (check_tutorial_message(QT_T_FIRE)) return;

	/* Item-dependent events. */

	{
	    int projectile_groups = 0;
	    int launcher_groups = 0;
	    struct obj *otmp;

	    for (otmp = invent; otmp; otmp = otmp->nobj) {
		if (otmp->bknown && otmp->cursed)
		    if (check_tutorial_message(QT_T_EQUIPCURSE)) return;

		if (otmp->oartifact)
		    if (check_tutorial_message(QT_T_ARTIFACT)) return;

		if (otmp->unpaid)
		    if (check_tutorial_message(QT_T_SHOPBUY)) return;

		if (!objects[otmp->otyp].oc_name_known) {
		    switch (objects[otmp->otyp].oc_class) {
		    case POTION_CLASS:
			if (otmp->otyp == POT_WATER) break;
			/* fall through */
		    case SCROLL_CLASS:
			if (otmp->otyp == SCR_BLANK_PAPER) break;
			/* fall through */
		    case WAND_CLASS:
		    case SPBOOK_CLASS:
			if (otmp->otyp == SPE_BLANK_PAPER) break;
			if (otmp->otyp == SPE_BOOK_OF_THE_DEAD) break;
			/* fall through */
		    case RING_CLASS:
		    case AMULET_CLASS:
			if (check_tutorial_message(QT_T_RANDAPPEARANCE)) return;
			break;
		    default:
			break;
		    }
		}

		/* Containers; minor spoiler here, in that it doesn't trigger
		   off a bag of tricks and a savvy player might notice that, but
		   that's not a freebie I'm worried about. */
		switch (otmp->otyp) {
		case SACK:
		    /* starting inventory for arcs/rogues, and we don't want to
		       give the message until a second container's listed */
		    if (Role_if(PM_ARCHEOLOGIST)) break;
		    if (Role_if(PM_ROGUE)) break;
		    /* otherwise fall through */
		case LARGE_BOX:
		case CHEST:
		case ICE_BOX:
		case OILSKIN_SACK:
		case BAG_OF_HOLDING:
		    if (check_tutorial_message(QT_T_ITEM_CONTAINER)) return;
		    break;
		default:
		    break;
		}

		/* Requiring a specific item during combat... */
		if (!tutorial_last_combat && old_tutorial_last_combat > 5) {
		    switch (otmp->otyp) {
		    /* Projectiles. */
		    case ARROW:
		    case ELVEN_ARROW:
		    case ORCISH_ARROW:
		    case SILVER_ARROW:
		    case YA:
			projectile_groups |= 0x1;
			break;
		    case CROSSBOW_BOLT:
			projectile_groups |= 0x2;
			break;
		    case FLINT:
		    case ROCK:
			projectile_groups |= 0x4;
			break;

		    /* Launchers. */
		    case BOW:
		    case ELVEN_BOW:
		    case ORCISH_BOW:
		    case YUMI:
			launcher_groups |= 0x1;
			break;
		    case CROSSBOW:
			launcher_groups |= 0x2;
			break;
		    case SLING:
			launcher_groups |= 0x4;
			break;

		    /* Thrown weapons. Don't count our wielded weapon in this. */
		    case DART:
		    case SHURIKEN:
		    case BOOMERANG:
		    case SPEAR:
		    case ELVEN_SPEAR:
		    case ORCISH_SPEAR:
		    case DWARVISH_SPEAR:
		    case JAVELIN:
		    case DAGGER:
		    case ELVEN_DAGGER:
		    case ORCISH_DAGGER:
		    case SILVER_DAGGER:
			if (otmp == uwep) break;
			if (check_tutorial_message(QT_T_THROWNWEAPONS)) return;
			break;

		    default:
			break;
		    }
		}
	    }
	    if (projectile_groups & launcher_groups)
		if (check_tutorial_message(QT_T_PROJECTILES)) return;
	}

	/* Items on the current square. */
	{
	    struct obj *otmp;
	    for (otmp = level->objects[u.ux][u.uy]; otmp; otmp = otmp->nexthere) {
		switch (otmp->otyp) {
		case LARGE_BOX:
		case CHEST:
		case ICE_BOX:
		    if (check_tutorial_message(QT_T_ITEM_CONTAINER)) return;
		    break;
		default:
		    break;
		}
	    }
	}

	/* Ambient messages that only come up outside combat */
	if (tutorial_last_combat > 5) {
	    if (check_tutorial_command_message > 0)
		if (check_tutorial_message(check_tutorial_command_message)) return;
	    if (moves >= 10)
		if (check_tutorial_message(QT_T_VIEWTUTORIAL)) return;
	    if (moves >= 30)
		if (check_tutorial_message(QT_T_CHECK_ITEMS)) return;
	    if (moves >= 60)
		if (check_tutorial_message(QT_T_OBJECTIVE)) return;
	    if (moves >= 100)
		if (check_tutorial_message(QT_T_SAVELOAD)) return;
	    if (moves >= 150)
		if (check_tutorial_message(QT_T_MESSAGERECALL)) return;
	}
}